

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall Executor::visit(Executor *this,FunctionResultCallNode *node)

{
  _func_int **pp_Var1;
  ExpressionNode *pEVar2;
  Value *value;
  Executor *this_00;
  TypeName local_44;
  undefined1 local_40 [32];
  
  pEVar2 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar2->super_Node)._vptr_Node + 0x10))(pEVar2,this);
  value = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
          super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
          super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  local_44 = Function;
  pp_Var1 = (_func_int **)(local_40 + 0x10);
  this_00 = (Executor *)local_40;
  local_40._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"function call","");
  assertValueType(this_00,value,&local_44,(string *)local_40,(Node *)node);
  if ((_func_int **)local_40._0_8_ != pp_Var1) {
    operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
  }
  local_40._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"result","");
  callValue(this,&node->super_CallNode,(string *)local_40,
            (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
            super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
            super__Head_base<0UL,_Value_*,_false>._M_head_impl);
  if ((_func_int **)local_40._0_8_ != pp_Var1) {
    operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
  }
  return;
}

Assistant:

void Executor::visit(const FunctionResultCallNode& node)
{
  node.getCall().accept(*this);
  assertValueType(*value_, TypeName::Function, "function call", node);

  callValue(node, "result", *value_);
}